

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.cpp
# Opt level: O2

void * MESThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int local_7d0;
  double distance;
  CHRONO chrono_period;
  char szTemp [256];
  MES mes;
  char szSaveFilePath [256];
  
  distance = 0.0;
  memset(&mes,0,0x538);
  StartChrono(&chrono_period);
  iVar10 = 100;
  bVar2 = false;
  local_7d0 = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)iVar10);
      if (bPauseMES == 0) break;
      if (!bVar2) {
        puts("MES paused.");
        DisconnectMES(&mes);
      }
      if (bExit != 0) goto LAB_0018698a;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartMES == 0) {
      if (bVar2) goto LAB_001867b0;
      iVar8 = GetLatestDataMES(&mes,&distance);
      if (iVar8 != 0) {
        puts("Connection to a MES lost.");
        DisconnectMES(&mes);
        goto LAB_001867cd;
      }
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      altitude_AGL = distance;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      bVar3 = false;
      bVar2 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a MES.");
        DisconnectMES(&mes);
      }
      bRestartMES = 0;
LAB_001867b0:
      iVar5 = ConnectMES(&mes,"MES0.txt");
      iVar8 = mes.threadperiod;
      if (iVar5 == 0) {
        if (mes.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)mes.pfSaveFile);
          mes.pfSaveFile = (FILE *)0x0;
        }
        iVar10 = iVar8;
        if (mes.bSaveRawData == 0) {
          bVar3 = false;
          bVar2 = true;
        }
        else {
          if (mes.szCfgFilePath[0] == '\0') {
            builtin_strncpy(szTemp,"mes",4);
          }
          else {
            sprintf(szTemp,"%.127s",mes.szCfgFilePath);
          }
          sVar6 = strlen(szTemp);
          iVar8 = (int)sVar6 + 1;
          uVar9 = sVar6 & 0xffffffff;
          do {
            if ((int)uVar9 < 1) goto LAB_001868df;
            uVar1 = uVar9 - 1;
            iVar8 = iVar8 + -1;
            lVar4 = uVar9 - 1;
            uVar9 = uVar1;
          } while (szTemp[lVar4] != '.');
          if ((uVar1 != 0) && (iVar8 <= (int)sVar6)) {
            memset(szTemp + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
          }
LAB_001868df:
          pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
          pcVar7 = strtimeex_fns();
          bVar3 = false;
          sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar7);
          pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
          mes.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
          bVar2 = true;
          if ((FILE *)mes.pfSaveFile == (FILE *)0x0) {
            puts("Unable to create MES data file.");
            bVar3 = false;
            goto LAB_0018698d;
          }
        }
      }
      else {
        mSleep(1000);
LAB_001867cd:
        local_7d0 = local_7d0 + 1;
        if (ExitOnErrorCount <= local_7d0 && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_0018698a:
          bVar3 = true;
          goto LAB_0018698d;
        }
        bVar2 = false;
        bVar3 = true;
      }
    }
    if (bExit != 0) {
LAB_0018698d:
      StopChronoQuick(&chrono_period);
      if (mes.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)mes.pfSaveFile);
        mes.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectMES(&mes);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MESThread(void* pParam)
{
	MES mes;
	double distance = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&mes, 0, sizeof(MES));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMES)
		{
			if (bConnected)
			{
				printf("MES paused.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMES)
		{
			if (bConnected)
			{
				printf("Restarting a MES.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			bRestartMES = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMES(&mes, "MES0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = mes.threadperiod;

				if (mes.pfSaveFile != NULL)
				{
					fclose(mes.pfSaveFile); 
					mes.pfSaveFile = NULL;
				}
				if ((mes.bSaveRawData)&&(mes.pfSaveFile == NULL)) 
				{
					if (strlen(mes.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", mes.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "mes");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					mes.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (mes.pfSaveFile == NULL) 
					{
						printf("Unable to create MES data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMES(&mes, &distance) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				altitude_AGL = distance;

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MES lost.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
		}

		//printf("MESThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (mes.pfSaveFile != NULL)
	{
		fclose(mes.pfSaveFile); 
		mes.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMES(&mes);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}